

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsize.h
# Opt level: O0

QSize __thiscall QSizeF::toSize(QSizeF *this)

{
  long lVar1;
  QSize *in_RDI;
  long in_FS_OFFSET;
  int in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined8 local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivate::qSaturateRound<double,_true>((double)in_RDI);
  QtPrivate::qSaturateRound<double,_true>((double)in_RDI);
  QSize::QSize(in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_10;
  }
  __stack_chk_fail();
}

Assistant:

constexpr inline QSize QSizeF::toSize() const noexcept
{
    return QSize(QtPrivate::qSaturateRound(wd), QtPrivate::qSaturateRound(ht));
}